

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_preview.cpp
# Opt level: O0

void __thiscall QPreviewPaintEngine::QPreviewPaintEngine(QPreviewPaintEngine *this)

{
  QPreviewPaintEnginePrivate *pQVar1;
  QPaintEngine *in_RDI;
  long in_FS_OFFSET;
  QPreviewPaintEnginePrivate *d;
  QFlags<QPaintEngine::PaintEngineFeature> *in_stack_ffffffffffffffc8;
  QFlag local_10;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QPreviewPaintEnginePrivate *)operator_new(0xe0);
  QPreviewPaintEnginePrivate::QPreviewPaintEnginePrivate(pQVar1);
  QFlag::QFlag(&local_10,0xfffeffff);
  QFlags<QPaintEngine::PaintEngineFeature>::QFlagsStorageHelper
            (in_stack_ffffffffffffffc8,(QFlag)(int)((ulong)pQVar1 >> 0x20));
  QPaintEngine::QPaintEngine(in_RDI,(QPaintEnginePrivate *)pQVar1,(QFlags_conflict *)(ulong)local_c)
  ;
  QPrintEngine::QPrintEngine((QPrintEngine *)(in_RDI + 0x20));
  *(undefined ***)in_RDI = &PTR__QPreviewPaintEngine_001a8c20;
  *(undefined ***)(in_RDI + 0x20) = &PTR__QPreviewPaintEngine_001a8d20;
  pQVar1 = d_func((QPreviewPaintEngine *)0x154a89);
  pQVar1->proxy_print_engine = (QPrintEngine *)0x0;
  pQVar1->proxy_paint_engine = (QPaintEngine *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QPreviewPaintEngine::QPreviewPaintEngine()
    : QPaintEngine(*(new QPreviewPaintEnginePrivate), PaintEngineFeatures(AllFeatures & ~ObjectBoundingModeGradients))
{
    Q_D(QPreviewPaintEngine);
    d->proxy_print_engine = nullptr;
    d->proxy_paint_engine = nullptr;
}